

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

void __thiscall
CaDiCaL::Proof::add_derived_unit_clause
          (Proof *this,uint64_t id,int internal_unit,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *chain)

{
  int iVar1;
  iterator __position;
  pointer puVar2;
  iterator __position_00;
  ulong uVar3;
  unsigned_long *cid;
  pointer __args;
  int external_lit;
  int local_2c;
  
  uVar3 = (ulong)(uint)-internal_unit;
  if (0 < internal_unit) {
    uVar3 = (ulong)(uint)internal_unit;
  }
  iVar1 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  local_2c = -iVar1;
  if (-1 < internal_unit) {
    local_2c = iVar1;
  }
  __position._M_current =
       (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->clause,__position,&local_2c);
  }
  else {
    *__position._M_current = local_2c;
    (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  __args = (chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__args != puVar2) {
    do {
      __position_00._M_current =
           (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->proof_chain,
                   __position_00,__args);
      }
      else {
        *__position_00._M_current = *__args;
        (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != puVar2);
  }
  this->clause_id = id;
  this->redundant = false;
  add_derived_clause(this);
  return;
}

Assistant:

void Proof::add_derived_unit_clause (uint64_t id, int internal_unit,
                                     const vector<uint64_t> &chain) {
  LOG ("PROOF adding unit clause %d", internal_unit);
  assert (proof_chain.empty ());
  assert (clause.empty ());
  add_literal (internal_unit);
  for (const auto &cid : chain)
    proof_chain.push_back (cid);
  clause_id = id;
  redundant = false;
  add_derived_clause ();
}